

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIndexingTests.cpp
# Opt level: O0

int __thiscall deqp::ShaderIndexingTests::init(ShaderIndexingTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  ShaderType SVar2;
  Context *pCVar3;
  TestCaseGroup *pTVar4;
  char *pcVar5;
  char *pcVar6;
  ShaderIndexingCase *pSVar7;
  char *pcVar8;
  char *pcVar9;
  ulong extraout_RAX;
  ulong uVar10;
  IndexAccessType local_a90;
  IndexAccessType local_a8c;
  VectorAccessType local_a48;
  VectorAccessType local_a44;
  IndexAccessType local_a00;
  IndexAccessType local_9fc;
  allocator<char> local_961;
  undefined1 local_960 [6];
  bool isVertexCase_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  undefined1 local_8a0 [8];
  string desc_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  undefined1 local_7b8 [8];
  string name_4;
  char *shaderTypeName_3;
  ShaderType shaderType_3;
  int shaderTypeNdx_3;
  char *readAccessName_3;
  char *writeAccessName_2;
  IndexAccessType writeAccess_2;
  IndexAccessType readAccess_3;
  int access_2;
  int isReadStatic_1;
  DataType varType_4;
  int typeNdx_4;
  TestCaseGroup *matGroup;
  undefined1 local_750 [6];
  bool isVertexCase_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  undefined1 local_690 [8];
  string desc_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  undefined1 local_5a8 [8];
  string name_3;
  char *shaderTypeName_2;
  ShaderType shaderType_2;
  int shaderTypeNdx_2;
  char *readAccessName_2;
  char *writeAccessName_1;
  VectorAccessType writeAccess_1;
  VectorAccessType readAccess_2;
  int access_1;
  int isReadDirect;
  DataType varType_3;
  int typeNdx_3;
  TestCaseGroup *vecGroup;
  undefined1 local_540 [6];
  bool isVertexCase_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  undefined1 local_480 [8];
  string desc_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  undefined1 local_398 [8];
  string name_2;
  char *shaderTypeName_1;
  ShaderType shaderType_1;
  int shaderTypeNdx_1;
  char *readAccessName_1;
  char *writeAccessName;
  IndexAccessType writeAccess;
  IndexAccessType readAccess_1;
  int access;
  int isReadStatic;
  DataType varType_2;
  int typeNdx_2;
  TestCaseGroup *tmpGroup;
  undefined1 local_330 [6];
  bool isVertexCase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [8];
  string desc_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string name_1;
  char *shaderTypeName;
  ShaderType shaderType;
  int shaderTypeNdx;
  char *readAccessName;
  int readAccess;
  DataType varType_1;
  int typeNdx_1;
  TestCaseGroup *uniformGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string name;
  char *fragAccessName;
  char *vertAccessName;
  IndexAccessType local_30;
  int fragAccess;
  int vertAccess;
  DataType varType;
  int typeNdx;
  TestCaseGroup *varyingGroup;
  ShaderIndexingTests *this_local;
  
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"varying_array",
             "Varying array access tests.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  for (vertAccess = 0; vertAccess < 4; vertAccess = vertAccess + 1) {
    DVar1 = init::s_floatAndVecTypes[vertAccess];
    for (local_30 = INDEXACCESS_STATIC; (int)local_30 < 4; local_30 = local_30 + INDEXACCESS_DYNAMIC
        ) {
      for (vertAccessName._4_4_ = INDEXACCESS_STATIC; (int)vertAccessName._4_4_ < 4;
          vertAccessName._4_4_ = vertAccessName._4_4_ + INDEXACCESS_DYNAMIC) {
        if ((local_30 != INDEXACCESS_STATIC) || (vertAccessName._4_4_ != INDEXACCESS_STATIC)) {
          pcVar5 = getIndexAccessTypeName(local_30);
          name.field_2._8_8_ = getIndexAccessTypeName(vertAccessName._4_4_);
          pcVar6 = glu::getDataTypeName(DVar1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_108,pcVar6,
                     (allocator<char> *)(desc.field_2._M_local_buf + 0xf));
          std::operator+(&local_e8,&local_108,"_");
          std::operator+(&local_c8,&local_e8,pcVar5);
          std::operator+(&local_a8,&local_c8,"_write_");
          std::operator+(&local_88,&local_a8,(char *)name.field_2._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68,&local_88,"_read");
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_108);
          std::allocator<char>::~allocator((allocator<char> *)(desc.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b0,"Varying array with ",
                     (allocator<char> *)((long)&uniformGroup + 7));
          std::operator+(&local_190,&local_1b0,pcVar5);
          std::operator+(&local_170,&local_190," write in vertex shader and ");
          std::operator+(&local_150,&local_170,(char *)name.field_2._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130,&local_150," read in fragment shader.");
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&uniformGroup + 7));
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pcVar5 = (char *)std::__cxx11::string::c_str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          pSVar7 = createVaryingArrayCase
                             (pCVar3,pcVar5,pcVar6,this->m_glslVersion,DVar1,local_30,
                              vertAccessName._4_4_);
          tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar7);
          std::__cxx11::string::~string((string *)local_130);
          std::__cxx11::string::~string((string *)local_68);
        }
      }
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"uniform_array",
             "Uniform array access tests.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  for (readAccess = 0; readAccess < 4; readAccess = readAccess + 1) {
    DVar1 = init::s_floatAndVecTypes[readAccess];
    for (readAccessName._4_4_ = INDEXACCESS_STATIC; (int)readAccessName._4_4_ < 4;
        readAccessName._4_4_ = readAccessName._4_4_ + INDEXACCESS_DYNAMIC) {
      pcVar5 = getIndexAccessTypeName(readAccessName._4_4_);
      for (shaderTypeName._4_4_ = 0; shaderTypeName._4_4_ < 2;
          shaderTypeName._4_4_ = shaderTypeName._4_4_ + 1) {
        SVar2 = init::s_shaderTypes[shaderTypeName._4_4_];
        name_1.field_2._8_8_ = glu::getShaderTypeName(SVar2);
        pcVar6 = glu::getDataTypeName(DVar1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_288,pcVar6,
                   (allocator<char> *)(desc_1.field_2._M_local_buf + 0xf));
        std::operator+(&local_268,&local_288,"_");
        std::operator+(&local_248,&local_268,pcVar5);
        std::operator+(&local_228,&local_248,"_read_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208,&local_228,(char *)name_1.field_2._8_8_);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_288);
        std::allocator<char>::~allocator((allocator<char> *)(desc_1.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_330,"Uniform array with ",
                   (allocator<char> *)((long)&tmpGroup + 7));
        std::operator+(&local_310,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_330,pcVar5);
        std::operator+(&local_2f0,&local_310," read in ");
        std::operator+(&local_2d0,&local_2f0,(char *)name_1.field_2._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b0,&local_2d0," shader.");
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)local_330);
        std::allocator<char>::~allocator((allocator<char> *)((long)&tmpGroup + 7));
        tmpGroup._6_1_ = SVar2 == SHADERTYPE_VERTEX;
        pCVar3 = (this->super_TestCaseGroup).m_context;
        pcVar6 = (char *)std::__cxx11::string::c_str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        pSVar7 = createUniformArrayCase
                           (pCVar3,pcVar6,pcVar8,this->m_glslVersion,(bool)(tmpGroup._6_1_ & 1),
                            DVar1,readAccessName._4_4_);
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)local_2b0);
        std::__cxx11::string::~string((string *)local_208);
      }
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"tmp_array",
             "Temporary array access tests.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  for (isReadStatic = 0; isReadStatic < 4; isReadStatic = isReadStatic + 1) {
    DVar1 = init::s_floatAndVecTypes[isReadStatic];
    for (readAccess_1 = INDEXACCESS_STATIC; (int)readAccess_1 < 2;
        readAccess_1 = readAccess_1 + INDEXACCESS_DYNAMIC) {
      for (writeAccess = INDEXACCESS_DYNAMIC; (int)writeAccess < 4;
          writeAccess = writeAccess + INDEXACCESS_DYNAMIC) {
        if (readAccess_1 == INDEXACCESS_STATIC) {
          local_a00 = INDEXACCESS_STATIC;
          local_9fc = writeAccess;
        }
        else {
          local_9fc = INDEXACCESS_STATIC;
          local_a00 = writeAccess;
        }
        pcVar5 = getIndexAccessTypeName(local_a00);
        pcVar6 = getIndexAccessTypeName(local_9fc);
        for (shaderTypeName_1._4_4_ = 0; shaderTypeName_1._4_4_ < 2;
            shaderTypeName_1._4_4_ = shaderTypeName_1._4_4_ + 1) {
          SVar2 = init::s_shaderTypes[shaderTypeName_1._4_4_];
          name_2.field_2._8_8_ = glu::getShaderTypeName(SVar2);
          pcVar8 = glu::getDataTypeName(DVar1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_458,pcVar8,
                     (allocator<char> *)(desc_2.field_2._M_local_buf + 0xf));
          std::operator+(&local_438,&local_458,"_");
          std::operator+(&local_418,&local_438,pcVar5);
          std::operator+(&local_3f8,&local_418,"_write_");
          std::operator+(&local_3d8,&local_3f8,pcVar6);
          std::operator+(&local_3b8,&local_3d8,"_read_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_398,&local_3b8,(char *)name_2.field_2._8_8_);
          std::__cxx11::string::~string((string *)&local_3b8);
          std::__cxx11::string::~string((string *)&local_3d8);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::~string((string *)&local_458);
          std::allocator<char>::~allocator((allocator<char> *)(desc_2.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_540,"Temporary array with ",
                     (allocator<char> *)((long)&vecGroup + 7));
          std::operator+(&local_520,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_540,pcVar5);
          std::operator+(&local_500,&local_520," write and ");
          std::operator+(&local_4e0,&local_500,pcVar6);
          std::operator+(&local_4c0,&local_4e0," read in ");
          std::operator+(&local_4a0,&local_4c0,(char *)name_2.field_2._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_480,&local_4a0," shader.");
          std::__cxx11::string::~string((string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_4c0);
          std::__cxx11::string::~string((string *)&local_4e0);
          std::__cxx11::string::~string((string *)&local_500);
          std::__cxx11::string::~string((string *)&local_520);
          std::__cxx11::string::~string((string *)local_540);
          std::allocator<char>::~allocator((allocator<char> *)((long)&vecGroup + 7));
          vecGroup._6_1_ = SVar2 == SHADERTYPE_VERTEX;
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pcVar8 = (char *)std::__cxx11::string::c_str();
          pcVar9 = (char *)std::__cxx11::string::c_str();
          pSVar7 = createTmpArrayCase(pCVar3,pcVar8,pcVar9,this->m_glslVersion,
                                      (bool)(vecGroup._6_1_ & 1),DVar1,local_a00,local_9fc);
          tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar7);
          std::__cxx11::string::~string((string *)local_480);
          std::__cxx11::string::~string((string *)local_398);
        }
      }
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"vector_subscript",
             "Vector subscript indexing.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  for (isReadDirect = 0; isReadDirect < 3; isReadDirect = isReadDirect + 1) {
    DVar1 = init::s_vectorTypes[isReadDirect];
    for (readAccess_2 = DIRECT; (int)readAccess_2 < 2; readAccess_2 = readAccess_2 + COMPONENT) {
      for (writeAccess_1 = SUBSCRIPT_STATIC; (int)writeAccess_1 < 6;
          writeAccess_1 = writeAccess_1 + COMPONENT) {
        if (readAccess_2 == DIRECT) {
          local_a48 = DIRECT;
          local_a44 = writeAccess_1;
        }
        else {
          local_a44 = DIRECT;
          local_a48 = writeAccess_1;
        }
        pcVar5 = getVectorAccessTypeName(local_a48);
        pcVar6 = getVectorAccessTypeName(local_a44);
        for (shaderTypeName_2._4_4_ = 0; shaderTypeName_2._4_4_ < 2;
            shaderTypeName_2._4_4_ = shaderTypeName_2._4_4_ + 1) {
          SVar2 = init::s_shaderTypes[shaderTypeName_2._4_4_];
          name_3.field_2._8_8_ = glu::getShaderTypeName(SVar2);
          pcVar8 = glu::getDataTypeName(DVar1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_668,pcVar8,
                     (allocator<char> *)(desc_3.field_2._M_local_buf + 0xf));
          std::operator+(&local_648,&local_668,"_");
          std::operator+(&local_628,&local_648,pcVar5);
          std::operator+(&local_608,&local_628,"_write_");
          std::operator+(&local_5e8,&local_608,pcVar6);
          std::operator+(&local_5c8,&local_5e8,"_read_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5a8,&local_5c8,(char *)name_3.field_2._8_8_);
          std::__cxx11::string::~string((string *)&local_5c8);
          std::__cxx11::string::~string((string *)&local_5e8);
          std::__cxx11::string::~string((string *)&local_608);
          std::__cxx11::string::~string((string *)&local_628);
          std::__cxx11::string::~string((string *)&local_648);
          std::__cxx11::string::~string((string *)&local_668);
          std::allocator<char>::~allocator((allocator<char> *)(desc_3.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_750,"Vector subscript access with ",
                     (allocator<char> *)((long)&matGroup + 7));
          std::operator+(&local_730,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_750,pcVar5);
          std::operator+(&local_710,&local_730," write and ");
          std::operator+(&local_6f0,&local_710,pcVar6);
          std::operator+(&local_6d0,&local_6f0," read in ");
          std::operator+(&local_6b0,&local_6d0,(char *)name_3.field_2._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_690,&local_6b0," shader.");
          std::__cxx11::string::~string((string *)&local_6b0);
          std::__cxx11::string::~string((string *)&local_6d0);
          std::__cxx11::string::~string((string *)&local_6f0);
          std::__cxx11::string::~string((string *)&local_710);
          std::__cxx11::string::~string((string *)&local_730);
          std::__cxx11::string::~string((string *)local_750);
          std::allocator<char>::~allocator((allocator<char> *)((long)&matGroup + 7));
          matGroup._6_1_ = SVar2 == SHADERTYPE_VERTEX;
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pcVar8 = (char *)std::__cxx11::string::c_str();
          pcVar9 = (char *)std::__cxx11::string::c_str();
          pSVar7 = createVectorSubscriptCase
                             (pCVar3,pcVar8,pcVar9,this->m_glslVersion,(bool)(matGroup._6_1_ & 1),
                              DVar1,local_a48,local_a44);
          tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar7);
          std::__cxx11::string::~string((string *)local_690);
          std::__cxx11::string::~string((string *)local_5a8);
        }
      }
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"matrix_subscript",
             "Matrix subscript indexing.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  isReadStatic_1 = 0;
  uVar10 = extraout_RAX;
  while (isReadStatic_1 < 9) {
    DVar1 = init::s_matrixTypes[isReadStatic_1];
    for (readAccess_3 = INDEXACCESS_STATIC; (int)readAccess_3 < 2;
        readAccess_3 = readAccess_3 + INDEXACCESS_DYNAMIC) {
      for (writeAccess_2 = INDEXACCESS_DYNAMIC; (int)writeAccess_2 < 4;
          writeAccess_2 = writeAccess_2 + INDEXACCESS_DYNAMIC) {
        if (readAccess_3 == INDEXACCESS_STATIC) {
          local_a90 = INDEXACCESS_STATIC;
          local_a8c = writeAccess_2;
        }
        else {
          local_a8c = INDEXACCESS_STATIC;
          local_a90 = writeAccess_2;
        }
        pcVar5 = getIndexAccessTypeName(local_a90);
        pcVar6 = getIndexAccessTypeName(local_a8c);
        for (shaderTypeName_3._4_4_ = 0; shaderTypeName_3._4_4_ < 2;
            shaderTypeName_3._4_4_ = shaderTypeName_3._4_4_ + 1) {
          SVar2 = init::s_shaderTypes[shaderTypeName_3._4_4_];
          name_4.field_2._8_8_ = glu::getShaderTypeName(SVar2);
          pcVar8 = glu::getDataTypeName(DVar1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_878,pcVar8,
                     (allocator<char> *)(desc_4.field_2._M_local_buf + 0xf));
          std::operator+(&local_858,&local_878,"_");
          std::operator+(&local_838,&local_858,pcVar5);
          std::operator+(&local_818,&local_838,"_write_");
          std::operator+(&local_7f8,&local_818,pcVar6);
          std::operator+(&local_7d8,&local_7f8,"_read_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_7b8,&local_7d8,(char *)name_4.field_2._8_8_);
          std::__cxx11::string::~string((string *)&local_7d8);
          std::__cxx11::string::~string((string *)&local_7f8);
          std::__cxx11::string::~string((string *)&local_818);
          std::__cxx11::string::~string((string *)&local_838);
          std::__cxx11::string::~string((string *)&local_858);
          std::__cxx11::string::~string((string *)&local_878);
          std::allocator<char>::~allocator((allocator<char> *)(desc_4.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_960,"Vector subscript access with ",&local_961);
          std::operator+(&local_940,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_960,pcVar5);
          std::operator+(&local_920,&local_940," write and ");
          std::operator+(&local_900,&local_920,pcVar6);
          std::operator+(&local_8e0,&local_900," read in ");
          std::operator+(&local_8c0,&local_8e0,(char *)name_4.field_2._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_8a0,&local_8c0," shader.");
          std::__cxx11::string::~string((string *)&local_8c0);
          std::__cxx11::string::~string((string *)&local_8e0);
          std::__cxx11::string::~string((string *)&local_900);
          std::__cxx11::string::~string((string *)&local_920);
          std::__cxx11::string::~string((string *)&local_940);
          std::__cxx11::string::~string((string *)local_960);
          std::allocator<char>::~allocator(&local_961);
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pcVar8 = (char *)std::__cxx11::string::c_str();
          pcVar9 = (char *)std::__cxx11::string::c_str();
          pSVar7 = createMatrixSubscriptCase
                             (pCVar3,pcVar8,pcVar9,this->m_glslVersion,SVar2 == SHADERTYPE_VERTEX,
                              DVar1,local_a90,local_a8c);
          tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar7);
          std::__cxx11::string::~string((string *)local_8a0);
          std::__cxx11::string::~string((string *)local_7b8);
        }
      }
    }
    isReadStatic_1 = isReadStatic_1 + 1;
    uVar10 = (ulong)(uint)isReadStatic_1;
  }
  return (int)uVar10;
}

Assistant:

void ShaderIndexingTests::init(void)
{
	static const DataType s_floatAndVecTypes[] = { TYPE_FLOAT, TYPE_FLOAT_VEC2, TYPE_FLOAT_VEC3, TYPE_FLOAT_VEC4 };

	static const ShaderType s_shaderTypes[] = { SHADERTYPE_VERTEX, SHADERTYPE_FRAGMENT };

	// Varying array access cases.
	{
		TestCaseGroup* varyingGroup = new TestCaseGroup(m_context, "varying_array", "Varying array access tests.");
		addChild(varyingGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int vertAccess = 0; vertAccess < INDEXACCESS_LAST; vertAccess++)
			{
				for (int fragAccess = 0; fragAccess < INDEXACCESS_LAST; fragAccess++)
				{
					if (vertAccess == INDEXACCESS_STATIC && fragAccess == INDEXACCESS_STATIC)
						continue;

					const char* vertAccessName = getIndexAccessTypeName((IndexAccessType)vertAccess);
					const char* fragAccessName = getIndexAccessTypeName((IndexAccessType)fragAccess);
					string		name =
						string(getDataTypeName(varType)) + "_" + vertAccessName + "_write_" + fragAccessName + "_read";
					string desc = string("Varying array with ") + vertAccessName + " write in vertex shader and " +
								  fragAccessName + " read in fragment shader.";
					varyingGroup->addChild(createVaryingArrayCase(m_context, name.c_str(), desc.c_str(), m_glslVersion,
																  varType, (IndexAccessType)vertAccess,
																  (IndexAccessType)fragAccess));
				}
			}
		}
	}

	// Uniform array access cases.
	{
		TestCaseGroup* uniformGroup = new TestCaseGroup(m_context, "uniform_array", "Uniform array access tests.");
		addChild(uniformGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
			{
				const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);
				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					ShaderType  shaderType	 = s_shaderTypes[shaderTypeNdx];
					const char* shaderTypeName = getShaderTypeName((ShaderType)shaderType);
					string name = string(getDataTypeName(varType)) + "_" + readAccessName + "_read_" + shaderTypeName;
					string desc =
						string("Uniform array with ") + readAccessName + " read in " + shaderTypeName + " shader.";
					bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
					uniformGroup->addChild(createUniformArrayCase(m_context, name.c_str(), desc.c_str(), m_glslVersion,
																  isVertexCase, varType, (IndexAccessType)readAccess));
				}
			}
		}
	}

	// Temporary array access cases.
	{
		TestCaseGroup* tmpGroup = new TestCaseGroup(m_context, "tmp_array", "Temporary array access tests.");
		addChild(tmpGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int isReadStatic = 0; isReadStatic < 2; isReadStatic++)
			{
				for (int access = INDEXACCESS_STATIC + 1; access < INDEXACCESS_LAST; access++)
				{
					IndexAccessType readAccess  = isReadStatic ? INDEXACCESS_STATIC : (IndexAccessType)access;
					IndexAccessType writeAccess = isReadStatic ? (IndexAccessType)access : INDEXACCESS_STATIC;

					const char* writeAccessName = getIndexAccessTypeName(writeAccess);
					const char* readAccessName  = getIndexAccessTypeName(readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType  shaderType	 = s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName = getShaderTypeName((ShaderType)shaderType);
						string		name = string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" +
									  readAccessName + "_read_" + shaderTypeName;
						string desc = string("Temporary array with ") + writeAccessName + " write and " +
									  readAccessName + " read in " + shaderTypeName + " shader.";
						bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						tmpGroup->addChild(createTmpArrayCase(m_context, name.c_str(), desc.c_str(), m_glslVersion,
															  isVertexCase, varType, (IndexAccessType)writeAccess,
															  (IndexAccessType)readAccess));
					}
				}
			}
		}
	}

	// Vector indexing with subscripts.
	{
		TestCaseGroup* vecGroup = new TestCaseGroup(m_context, "vector_subscript", "Vector subscript indexing.");
		addChild(vecGroup);

		static const DataType s_vectorTypes[] = { TYPE_FLOAT_VEC2, TYPE_FLOAT_VEC3, TYPE_FLOAT_VEC4 };

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_vectorTypes); typeNdx++)
		{
			DataType varType = s_vectorTypes[typeNdx];
			for (int isReadDirect = 0; isReadDirect < 2; isReadDirect++)
			{
				for (int access = SUBSCRIPT_STATIC; access < VECTORACCESS_LAST; access++)
				{
					VectorAccessType readAccess  = isReadDirect ? DIRECT : (VectorAccessType)access;
					VectorAccessType writeAccess = isReadDirect ? (VectorAccessType)access : DIRECT;

					const char* writeAccessName = getVectorAccessTypeName(writeAccess);
					const char* readAccessName  = getVectorAccessTypeName(readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType  shaderType	 = s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName = getShaderTypeName((ShaderType)shaderType);
						string		name = string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" +
									  readAccessName + "_read_" + shaderTypeName;
						string desc = string("Vector subscript access with ") + writeAccessName + " write and " +
									  readAccessName + " read in " + shaderTypeName + " shader.";
						bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						vecGroup->addChild(createVectorSubscriptCase(
							m_context, name.c_str(), desc.c_str(), m_glslVersion, isVertexCase, varType,
							(VectorAccessType)writeAccess, (VectorAccessType)readAccess));
					}
				}
			}
		}
	}

	// Matrix indexing with subscripts.
	{
		TestCaseGroup* matGroup = new TestCaseGroup(m_context, "matrix_subscript", "Matrix subscript indexing.");
		addChild(matGroup);

		static const DataType s_matrixTypes[] = { TYPE_FLOAT_MAT2,   TYPE_FLOAT_MAT2X3, TYPE_FLOAT_MAT2X4,
												  TYPE_FLOAT_MAT3X2, TYPE_FLOAT_MAT3,   TYPE_FLOAT_MAT3X4,
												  TYPE_FLOAT_MAT4X2, TYPE_FLOAT_MAT4X3, TYPE_FLOAT_MAT4 };

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_matrixTypes); typeNdx++)
		{
			DataType varType = s_matrixTypes[typeNdx];
			for (int isReadStatic = 0; isReadStatic < 2; isReadStatic++)
			{
				for (int access = INDEXACCESS_STATIC + 1; access < INDEXACCESS_LAST; access++)
				{
					IndexAccessType readAccess  = isReadStatic ? INDEXACCESS_STATIC : (IndexAccessType)access;
					IndexAccessType writeAccess = isReadStatic ? (IndexAccessType)access : INDEXACCESS_STATIC;

					const char* writeAccessName = getIndexAccessTypeName(writeAccess);
					const char* readAccessName  = getIndexAccessTypeName(readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType  shaderType	 = s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName = getShaderTypeName((ShaderType)shaderType);
						string		name = string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" +
									  readAccessName + "_read_" + shaderTypeName;
						string desc = string("Vector subscript access with ") + writeAccessName + " write and " +
									  readAccessName + " read in " + shaderTypeName + " shader.";
						bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						matGroup->addChild(createMatrixSubscriptCase(
							m_context, name.c_str(), desc.c_str(), m_glslVersion, isVertexCase, varType,
							(IndexAccessType)writeAccess, (IndexAccessType)readAccess));
					}
				}
			}
		}
	}
}